

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubytearray.h
# Opt level: O2

UByteArray * __thiscall
UByteArray::right(UByteArray *__return_storage_ptr__,UByteArray *this,int32_t len)

{
  string local_30 [32];
  
  std::__cxx11::string::substr((ulong)local_30,(ulong)this);
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_30);
  std::__cxx11::string::~string(local_30);
  return __return_storage_ptr__;
}

Assistant:

UByteArray right(int32_t len) const { return d.substr(d.size() - len, len); }